

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp_conn.c
# Opt level: O3

void uo_tcp_conn_recv(uo_cb *cb)

{
  uo_tcp_conn *tcp_conn;
  void *rel_offset;
  
  tcp_conn = (uo_tcp_conn *)uo_cb_stack_index(cb,0);
  rel_offset = uo_cb_stack_pop(cb);
  if (rel_offset == (void *)0x0) {
    uo_cb_stack_pop(cb);
    uo_tcp_conn_next_state(tcp_conn,'c');
  }
  else {
    (tcp_conn->evt_arg).after_recv.last_recv_len = (size_t)rel_offset;
    uo_buf_set_ptr_rel(tcp_conn->rbuf,(ptrdiff_t)rel_offset);
    uo_cb_append_cb(cb,tcp_conn->evt_handlers->after_recv);
  }
  uo_cb_append_func(cb,uo_tcp_conn_advance);
  uo_cb_invoke(cb);
  return;
}

Assistant:

static void uo_tcp_conn_recv(
    uo_cb *cb)
{
    uo_tcp_conn *tcp_conn = uo_cb_stack_index(cb, 0);

    size_t len = (uintptr_t)uo_cb_stack_pop(cb);

    if (len)
    {
        tcp_conn->evt_arg.after_recv.last_recv_len = len;
        uo_buf_set_ptr_rel(tcp_conn->rbuf, len);

        uo_cb_append(cb, tcp_conn->evt_handlers->after_recv);
    }
    else
    {
        // TODO: handle errors properly
        uo_cb_stack_pop(cb); // remove error code
        uo_tcp_conn_next_close(tcp_conn);
    }

    uo_cb_append(cb, uo_tcp_conn_advance);

    uo_cb_invoke(cb);
}